

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void XML_SetUserData(XML_Parser parser,void *p)

{
  void *pvVar1;
  
  if ((parser != (XML_Parser)0x0) &&
     (pvVar1 = parser->m_userData, parser->m_userData = p, parser->m_handlerArg == pvVar1)) {
    parser->m_handlerArg = p;
    return;
  }
  return;
}

Assistant:

void XMLCALL
XML_SetUserData(XML_Parser parser, void *p)
{
  if (parser == NULL)
    return;
  if (handlerArg == userData)
    handlerArg = userData = p;
  else
    userData = p;
}